

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void __thiscall
embree::sse42::
BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorK<4>_>,_false>
::occluded(BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorK<4>_>,_false>
           *this,vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  CollideFunc p_Var7;
  char *pcVar8;
  IntersectFunc p_Var9;
  OccludedFunc p_Var10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  Intersectors *pIVar14;
  size_t sVar15;
  NodeRef *pNVar16;
  size_t sVar17;
  size_t sVar18;
  Primitive_conflict4 *prim;
  uint i;
  long lVar19;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar20;
  int iVar21;
  float fVar22;
  float fVar31;
  float fVar32;
  vint4 bi;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar33;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar36;
  float fVar37;
  float fVar40;
  float fVar41;
  vint4 bi_1;
  float fVar42;
  undefined1 auVar38 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar39;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  vint4 ai;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar53;
  float fVar54;
  vint4 ai_1;
  undefined1 auVar52 [16];
  float fVar55;
  float fVar56;
  float fVar58;
  float fVar59;
  vint4 ai_3;
  undefined1 auVar57 [16];
  float fVar60;
  uint uVar62;
  uint uVar63;
  vint4 bi_2;
  uint uVar64;
  undefined1 auVar61 [16];
  float fVar65;
  float fVar67;
  float fVar68;
  vint4 bi_3;
  undefined1 auVar66 [16];
  float fVar69;
  float fVar70;
  uint uVar71;
  float fVar72;
  uint uVar73;
  float fVar74;
  uint uVar75;
  vint4 ai_2;
  float fVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  int iVar90;
  int iVar91;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar92;
  float fVar93;
  float fVar95;
  float fVar96;
  vint4 bi_8;
  undefined1 auVar94 [16];
  float fVar97;
  vbool<4> vVar98;
  Precalculations pre;
  undefined1 local_17a8 [16];
  vbool<4> valid0;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  uint local_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar12 = *(ulong *)((valid_i->field_0).v[0] + 0x70);
  if (uVar12 != 8) {
    pIVar14 = This;
    if ((*(long *)(ray + 8) != 0) &&
       (pIVar14 = *(Intersectors **)(ray + 0x10), ((ulong)pIVar14->ptr & 0x10000) != 0)) {
      occludedCoherent(this,valid_i,This,ray,context);
      return;
    }
    auVar26 = *(undefined1 (*) [16])&(This->intersector4_nofilter).name;
    uVar78 = -(uint)(0.0 <= auVar26._0_4_ && *(int *)this == -1);
    uVar79 = -(uint)(0.0 <= auVar26._4_4_ && *(int *)(this + 4) == -1);
    uVar80 = -(uint)(0.0 <= auVar26._8_4_ && *(int *)(this + 8) == -1);
    uVar81 = -(uint)(0.0 <= auVar26._12_4_ && *(int *)(this + 0xc) == -1);
    auVar35._4_4_ = uVar79;
    auVar35._0_4_ = uVar78;
    auVar35._8_4_ = uVar80;
    auVar35._12_4_ = uVar81;
    iVar13 = movmskps((int)pIVar14,auVar35);
    if (iVar13 != 0) {
      auVar52._0_8_ = (This->intersector4).intersect;
      auVar52._8_8_ = (This->intersector4).occluded;
      fVar70 = (float)DAT_01f4bd50;
      fVar72 = DAT_01f4bd50._4_4_;
      fVar74 = DAT_01f4bd50._8_4_;
      fVar76 = DAT_01f4bd50._12_4_;
      auVar66._4_4_ = -(uint)(ABS((float)((ulong)auVar52._0_8_ >> 0x20)) < fVar72);
      auVar66._0_4_ = -(uint)(ABS((float)auVar52._0_8_) < fVar70);
      auVar66._8_4_ = -(uint)(ABS((float)auVar52._8_8_) < fVar74);
      auVar66._12_4_ = -(uint)(ABS((float)((ulong)auVar52._8_8_ >> 0x20)) < fVar76);
      auVar66 = blendvps(auVar52,_DAT_01f4bd50,auVar66);
      auVar35 = *(undefined1 (*) [16])&(This->intersector4).name;
      auVar23._4_4_ = -(uint)(ABS(auVar35._4_4_) < fVar72);
      auVar23._0_4_ = -(uint)(ABS(auVar35._0_4_) < fVar70);
      auVar23._8_4_ = -(uint)(ABS(auVar35._8_4_) < fVar74);
      auVar23._12_4_ = -(uint)(ABS(auVar35._12_4_) < fVar76);
      auVar52 = blendvps(auVar35,_DAT_01f4bd50,auVar23);
      auVar94._0_8_ = (This->intersector1).pointQuery;
      auVar94._8_8_ = (This->intersector1).name;
      auVar57._0_8_ = (This->intersector4_filter).occluded;
      auVar57._8_8_ = (This->intersector4_filter).name;
      iVar13 = -(uint)(ABS((float)auVar57._8_8_) < fVar74);
      iVar21 = -(uint)(ABS((float)((ulong)auVar57._8_8_ >> 0x20)) < fVar76);
      auVar34._0_8_ =
           CONCAT44(-(uint)(ABS((float)((ulong)auVar57._0_8_ >> 0x20)) < fVar72),
                    -(uint)(ABS((float)auVar57._0_8_) < fVar70));
      auVar34._8_4_ = iVar13;
      auVar34._12_4_ = iVar21;
      auVar24._8_4_ = iVar13;
      auVar24._0_8_ = auVar34._0_8_;
      auVar24._12_4_ = iVar21;
      auVar57 = blendvps(auVar57,_DAT_01f4bd50,auVar24);
      auVar35 = rcpps(auVar34,auVar66);
      fVar86 = auVar35._0_4_;
      fVar87 = auVar35._4_4_;
      fVar88 = auVar35._8_4_;
      fVar89 = auVar35._12_4_;
      auVar35 = maxps(auVar94,ZEXT816(0));
      iVar13 = (int)DAT_01f45a30;
      iVar21 = DAT_01f45a30._4_4_;
      iVar90 = DAT_01f45a30._8_4_;
      iVar91 = DAT_01f45a30._12_4_;
      auVar25._4_4_ = uVar79;
      auVar25._0_4_ = uVar78;
      auVar25._8_4_ = uVar80;
      auVar25._12_4_ = uVar81;
      aVar92.v = (__m128)blendvps(_DAT_01f45a30,auVar35,auVar25);
      auVar35 = maxps(auVar26,ZEXT816(0));
      auVar94 = blendvps(_DAT_01f45a40,auVar35,auVar25);
      auVar26 = rcpps(auVar25,auVar52);
      fVar43 = auVar26._0_4_;
      fVar45 = auVar26._4_4_;
      fVar47 = auVar26._8_4_;
      fVar49 = auVar26._12_4_;
      auVar26 = rcpps(auVar35,auVar57);
      fVar82 = auVar26._0_4_;
      fVar83 = auVar26._4_4_;
      fVar84 = auVar26._8_4_;
      fVar85 = auVar26._12_4_;
      fVar70 = *(float *)&This->ptr;
      fVar72 = *(float *)((long)&This->ptr + 4);
      fVar74 = *(float *)&This->leafIntersector;
      fVar76 = *(float *)((long)&This->leafIntersector + 4);
      fVar43 = (1.0 - auVar52._0_4_ * fVar43) * fVar43 + fVar43;
      fVar45 = (1.0 - auVar52._4_4_ * fVar45) * fVar45 + fVar45;
      fVar47 = (1.0 - auVar52._8_4_ * fVar47) * fVar47 + fVar47;
      fVar49 = (1.0 - auVar52._12_4_ * fVar49) * fVar49 + fVar49;
      p_Var7 = (This->collider).collide;
      pcVar8 = (This->collider).name;
      fVar86 = (1.0 - auVar66._0_4_ * fVar86) * fVar86 + fVar86;
      fVar87 = (1.0 - auVar66._4_4_ * fVar87) * fVar87 + fVar87;
      fVar88 = (1.0 - auVar66._8_4_ * fVar88) * fVar88 + fVar88;
      fVar89 = (1.0 - auVar66._12_4_ * fVar89) * fVar89 + fVar89;
      p_Var9 = (This->intersector1).intersect;
      p_Var10 = (This->intersector1).occluded;
      fVar82 = (1.0 - auVar57._0_4_ * fVar82) * fVar82 + fVar82;
      fVar83 = (1.0 - auVar57._4_4_ * fVar83) * fVar83 + fVar83;
      fVar84 = (1.0 - auVar57._8_4_ * fVar84) * fVar84 + fVar84;
      fVar85 = (1.0 - auVar57._12_4_ * fVar85) * fVar85 + fVar85;
      local_17a8._0_8_ = CONCAT44(uVar79,uVar78) ^ 0xffffffffffffffff;
      local_17a8._8_4_ = uVar80 ^ 0xffffffff;
      local_17a8._12_4_ = uVar81 ^ 0xffffffff;
      pNVar16 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar20 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_node[1].ptr = uVar12;
      stack_near[1].field_0 = aVar92;
LAB_006dc677:
      pNVar1 = pNVar16 + -1;
      if (pNVar1->ptr != 0xfffffffffffffff8) {
        pNVar16 = pNVar16 + -1;
        aVar36 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar20[-1].v;
        paVar20 = paVar20 + -1;
        fVar93 = auVar94._0_4_;
        fVar95 = auVar94._4_4_;
        fVar96 = auVar94._8_4_;
        fVar97 = auVar94._12_4_;
        auVar26._4_4_ = -(uint)(aVar36.v[1] < fVar95);
        auVar26._0_4_ = -(uint)(aVar36.v[0] < fVar93);
        auVar26._8_4_ = -(uint)(aVar36.v[2] < fVar96);
        auVar26._12_4_ = -(uint)(aVar36._12_4_ < fVar97);
        uVar11 = movmskps((int)uVar12,auVar26);
        uVar12 = (ulong)uVar11;
        sVar18 = pNVar1->ptr;
        if (uVar11 != 0) {
          do {
            if ((sVar18 & 8) != 0) {
              if (sVar18 == 0xfffffffffffffff8) goto LAB_006dc8e0;
              auVar28._4_4_ = -(uint)(aVar36.v[1] < fVar95);
              auVar28._0_4_ = -(uint)(aVar36.v[0] < fVar93);
              auVar28._8_4_ = -(uint)(aVar36.v[2] < fVar96);
              auVar28._12_4_ = -(uint)(aVar36.v[3] < fVar97);
              uVar11 = movmskps((int)uVar12,auVar28);
              uVar12 = (ulong)uVar11;
              if (uVar11 != 0) {
                valid0.field_0._0_8_ = local_17a8._0_8_ ^ 0xffffffffffffffff;
                valid0.field_0.i[2] = local_17a8._8_4_ ^ 0xffffffff;
                valid0.field_0.i[3] = local_17a8._12_4_ ^ 0xffffffff;
                lVar19 = (ulong)((uint)sVar18 & 0xf) - 7;
                prim = (Primitive_conflict4 *)(sVar18 & 0xfffffffffffffff0);
                goto LAB_006dc83f;
              }
              break;
            }
            uVar12 = sVar18 & 0xfffffffffffffff0;
            aVar36.i[1] = iVar21;
            aVar36.i[0] = iVar13;
            aVar36.i[2] = iVar90;
            aVar36.i[3] = iVar91;
            sVar17 = 8;
            for (lVar19 = 0; (lVar19 != 4 && (sVar2 = *(size_t *)(uVar12 + lVar19 * 8), sVar2 != 8))
                ; lVar19 = lVar19 + 1) {
              fVar69 = *(float *)(sVar18 + 0x20 + lVar19 * 4);
              fVar33 = *(float *)(sVar18 + 0x30 + lVar19 * 4);
              fVar22 = *(float *)(sVar18 + 0x40 + lVar19 * 4);
              fVar42 = *(float *)(sVar18 + 0x50 + lVar19 * 4);
              fVar44 = (fVar69 - fVar70) * fVar86;
              fVar46 = (fVar69 - fVar72) * fVar87;
              fVar48 = (fVar69 - fVar74) * fVar88;
              fVar50 = (fVar69 - fVar76) * fVar89;
              local_1708 = SUB84(p_Var7,0);
              fStack_1704 = (float)((ulong)p_Var7 >> 0x20);
              fStack_1700 = SUB84(pcVar8,0);
              fStack_16fc = (float)((ulong)pcVar8 >> 0x20);
              fVar51 = (fVar22 - local_1708) * fVar43;
              fVar53 = (fVar22 - fStack_1704) * fVar45;
              fVar54 = (fVar22 - fStack_1700) * fVar47;
              fVar55 = (fVar22 - fStack_16fc) * fVar49;
              fVar69 = *(float *)(sVar18 + 0x60 + lVar19 * 4);
              local_1718 = SUB84(p_Var9,0);
              fStack_1714 = (float)((ulong)p_Var9 >> 0x20);
              fStack_1710 = SUB84(p_Var10,0);
              fStack_170c = (float)((ulong)p_Var10 >> 0x20);
              fVar56 = (fVar69 - local_1718) * fVar82;
              fVar58 = (fVar69 - fStack_1714) * fVar83;
              fVar59 = (fVar69 - fStack_1710) * fVar84;
              fVar60 = (fVar69 - fStack_170c) * fVar85;
              fVar22 = (fVar33 - fVar70) * fVar86;
              fVar31 = (fVar33 - fVar72) * fVar87;
              fVar32 = (fVar33 - fVar74) * fVar88;
              fVar33 = (fVar33 - fVar76) * fVar89;
              fVar37 = (fVar42 - local_1708) * fVar43;
              fVar40 = (fVar42 - fStack_1704) * fVar45;
              fVar41 = (fVar42 - fStack_1700) * fVar47;
              fVar42 = (fVar42 - fStack_16fc) * fVar49;
              fVar69 = *(float *)(sVar18 + 0x70 + lVar19 * 4);
              fVar65 = (fVar69 - local_1718) * fVar82;
              fVar67 = (fVar69 - fStack_1714) * fVar83;
              fVar68 = (fVar69 - fStack_1710) * fVar84;
              fVar69 = (fVar69 - fStack_170c) * fVar85;
              uVar11 = (uint)((int)fVar22 < (int)fVar44) * (int)fVar22 |
                       (uint)((int)fVar22 >= (int)fVar44) * (int)fVar44;
              uVar62 = (uint)((int)fVar31 < (int)fVar46) * (int)fVar31 |
                       (uint)((int)fVar31 >= (int)fVar46) * (int)fVar46;
              uVar63 = (uint)((int)fVar32 < (int)fVar48) * (int)fVar32 |
                       (uint)((int)fVar32 >= (int)fVar48) * (int)fVar48;
              uVar64 = (uint)((int)fVar33 < (int)fVar50) * (int)fVar33 |
                       (uint)((int)fVar33 >= (int)fVar50) * (int)fVar50;
              uVar71 = (uint)((int)fVar37 < (int)fVar51) * (int)fVar37 |
                       (uint)((int)fVar37 >= (int)fVar51) * (int)fVar51;
              uVar73 = (uint)((int)fVar40 < (int)fVar53) * (int)fVar40 |
                       (uint)((int)fVar40 >= (int)fVar53) * (int)fVar53;
              uVar75 = (uint)((int)fVar41 < (int)fVar54) * (int)fVar41 |
                       (uint)((int)fVar41 >= (int)fVar54) * (int)fVar54;
              uVar77 = (uint)((int)fVar42 < (int)fVar55) * (int)fVar42 |
                       (uint)((int)fVar42 >= (int)fVar55) * (int)fVar55;
              uVar71 = ((int)uVar71 < (int)uVar11) * uVar11 | ((int)uVar71 >= (int)uVar11) * uVar71;
              uVar73 = ((int)uVar73 < (int)uVar62) * uVar62 | ((int)uVar73 >= (int)uVar62) * uVar73;
              uVar75 = ((int)uVar75 < (int)uVar63) * uVar63 | ((int)uVar75 >= (int)uVar63) * uVar75;
              uVar77 = ((int)uVar77 < (int)uVar64) * uVar64 | ((int)uVar77 >= (int)uVar64) * uVar77;
              uVar11 = (uint)((int)fVar65 < (int)fVar56) * (int)fVar65 |
                       (uint)((int)fVar65 >= (int)fVar56) * (int)fVar56;
              uVar62 = (uint)((int)fVar67 < (int)fVar58) * (int)fVar67 |
                       (uint)((int)fVar67 >= (int)fVar58) * (int)fVar58;
              uVar63 = (uint)((int)fVar68 < (int)fVar59) * (int)fVar68 |
                       (uint)((int)fVar68 >= (int)fVar59) * (int)fVar59;
              uVar64 = (uint)((int)fVar69 < (int)fVar60) * (int)fVar69 |
                       (uint)((int)fVar69 >= (int)fVar60) * (int)fVar60;
              auVar61._0_4_ =
                   ((int)uVar11 < (int)uVar71) * uVar71 | ((int)uVar11 >= (int)uVar71) * uVar11;
              auVar61._4_4_ =
                   ((int)uVar62 < (int)uVar73) * uVar73 | ((int)uVar62 >= (int)uVar73) * uVar62;
              auVar61._8_4_ =
                   ((int)uVar63 < (int)uVar75) * uVar75 | ((int)uVar63 >= (int)uVar75) * uVar63;
              auVar61._12_4_ =
                   ((int)uVar64 < (int)uVar77) * uVar77 | ((int)uVar64 >= (int)uVar77) * uVar64;
              uVar11 = (uint)((int)fVar22 < (int)fVar44) * (int)fVar44 |
                       (uint)((int)fVar22 >= (int)fVar44) * (int)fVar22;
              uVar62 = (uint)((int)fVar31 < (int)fVar46) * (int)fVar46 |
                       (uint)((int)fVar31 >= (int)fVar46) * (int)fVar31;
              uVar63 = (uint)((int)fVar32 < (int)fVar48) * (int)fVar48 |
                       (uint)((int)fVar32 >= (int)fVar48) * (int)fVar32;
              uVar64 = (uint)((int)fVar33 < (int)fVar50) * (int)fVar50 |
                       (uint)((int)fVar33 >= (int)fVar50) * (int)fVar33;
              uVar71 = (uint)((int)fVar37 < (int)fVar51) * (int)fVar51 |
                       (uint)((int)fVar37 >= (int)fVar51) * (int)fVar37;
              uVar73 = (uint)((int)fVar40 < (int)fVar53) * (int)fVar53 |
                       (uint)((int)fVar40 >= (int)fVar53) * (int)fVar40;
              uVar75 = (uint)((int)fVar41 < (int)fVar54) * (int)fVar54 |
                       (uint)((int)fVar41 >= (int)fVar54) * (int)fVar41;
              uVar77 = (uint)((int)fVar42 < (int)fVar55) * (int)fVar55 |
                       (uint)((int)fVar42 >= (int)fVar55) * (int)fVar42;
              uVar11 = ((int)uVar11 < (int)uVar71) * uVar11 | ((int)uVar11 >= (int)uVar71) * uVar71;
              uVar62 = ((int)uVar62 < (int)uVar73) * uVar62 | ((int)uVar62 >= (int)uVar73) * uVar73;
              uVar63 = ((int)uVar63 < (int)uVar75) * uVar63 | ((int)uVar63 >= (int)uVar75) * uVar75;
              uVar64 = ((int)uVar64 < (int)uVar77) * uVar64 | ((int)uVar64 >= (int)uVar77) * uVar77;
              uVar71 = (uint)((int)fVar65 < (int)fVar56) * (int)fVar56 |
                       (uint)((int)fVar65 >= (int)fVar56) * (int)fVar65;
              uVar73 = (uint)((int)fVar67 < (int)fVar58) * (int)fVar58 |
                       (uint)((int)fVar67 >= (int)fVar58) * (int)fVar67;
              uVar75 = (uint)((int)fVar68 < (int)fVar59) * (int)fVar59 |
                       (uint)((int)fVar68 >= (int)fVar59) * (int)fVar68;
              uVar77 = (uint)((int)fVar69 < (int)fVar60) * (int)fVar60 |
                       (uint)((int)fVar69 >= (int)fVar60) * (int)fVar69;
              iVar3 = aVar92.i[0];
              iVar4 = aVar92.i[1];
              iVar5 = aVar92.i[2];
              iVar6 = aVar92.i[3];
              uVar71 = (uint)((int)fVar93 < (int)uVar71) * (int)fVar93 |
                       ((int)fVar93 >= (int)uVar71) * uVar71;
              uVar73 = (uint)((int)fVar95 < (int)uVar73) * (int)fVar95 |
                       ((int)fVar95 >= (int)uVar73) * uVar73;
              uVar75 = (uint)((int)fVar96 < (int)uVar75) * (int)fVar96 |
                       ((int)fVar96 >= (int)uVar75) * uVar75;
              uVar77 = (uint)((int)fVar97 < (int)uVar77) * (int)fVar97 |
                       ((int)fVar97 >= (int)uVar77) * uVar77;
              auVar27._4_4_ =
                   -(uint)((float)((uint)((int)auVar61._4_4_ < iVar4) * iVar4 |
                                  ((int)auVar61._4_4_ >= iVar4) * auVar61._4_4_) <=
                          (float)(((int)uVar62 < (int)uVar73) * uVar62 |
                                 ((int)uVar62 >= (int)uVar73) * uVar73));
              auVar27._0_4_ =
                   -(uint)((float)((uint)((int)auVar61._0_4_ < iVar3) * iVar3 |
                                  ((int)auVar61._0_4_ >= iVar3) * auVar61._0_4_) <=
                          (float)(((int)uVar11 < (int)uVar71) * uVar11 |
                                 ((int)uVar11 >= (int)uVar71) * uVar71));
              auVar27._8_4_ =
                   -(uint)((float)((uint)((int)auVar61._8_4_ < iVar5) * iVar5 |
                                  ((int)auVar61._8_4_ >= iVar5) * auVar61._8_4_) <=
                          (float)(((int)uVar63 < (int)uVar75) * uVar63 |
                                 ((int)uVar63 >= (int)uVar75) * uVar75));
              auVar27._12_4_ =
                   -(uint)((float)((uint)((int)auVar61._12_4_ < iVar6) * iVar6 |
                                  ((int)auVar61._12_4_ >= iVar6) * auVar61._12_4_) <=
                          (float)(((int)uVar64 < (int)uVar77) * uVar64 |
                                 ((int)uVar64 >= (int)uVar77) * uVar77));
              uVar11 = movmskps((int)this,auVar27);
              this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorK<4>_>,_false>
                      *)(ulong)uVar11;
              sVar15 = sVar17;
              aVar39 = aVar36;
              if ((uVar11 != 0) &&
                 (auVar38._4_4_ = iVar21, auVar38._0_4_ = iVar13, auVar38._8_4_ = iVar90,
                 auVar38._12_4_ = iVar91,
                 aVar39 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                          blendvps(auVar38,auVar61,auVar27), sVar15 = sVar2, sVar17 != 8)) {
                pNVar16->ptr = sVar17;
                pNVar16 = pNVar16 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar20->v = aVar36;
                paVar20 = paVar20 + 1;
              }
              aVar36 = aVar39;
              sVar17 = sVar15;
            }
            sVar18 = sVar17;
          } while (sVar17 != 8);
        }
        goto LAB_006dc677;
      }
LAB_006dc8e0:
      auVar30._0_4_ = uVar78 & local_17a8._0_4_;
      auVar30._4_4_ = uVar79 & local_17a8._4_4_;
      auVar30._8_4_ = uVar80 & local_17a8._8_4_;
      auVar30._12_4_ = uVar81 & local_17a8._12_4_;
      auVar26 = blendvps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,_DAT_01f45a40,
                         auVar30);
      *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar26;
    }
  }
  return;
  while( true ) {
    this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorK<4>_>,_false>
            *)&local_16e8;
    vVar98 = InstanceArrayIntersectorK<4>::occluded
                       ((InstanceArrayIntersectorK<4> *)this,&valid0,&pre,(RayK<4> *)This,
                        (RayQueryContext *)ray,prim);
    valid0.field_0.i[0] = ~local_16e8 & valid0.field_0.i[0];
    valid0.field_0.i[1] = ~uStack_16e4 & valid0.field_0.i[1];
    valid0.field_0.i[2] = ~uStack_16e0 & valid0.field_0.i[2];
    valid0.field_0.i[3] = ~uStack_16dc & valid0.field_0.i[3];
    uVar11 = movmskps(vVar98.field_0._0_4_,(undefined1  [16])valid0.field_0);
    uVar12 = (ulong)uVar11;
    prim = prim + 1;
    if (uVar11 == 0) break;
LAB_006dc83f:
    uVar11 = (uint)uVar12;
    lVar19 = lVar19 + -1;
    if (lVar19 == 0) break;
  }
  auVar29._0_8_ = valid0.field_0._0_8_ ^ 0xffffffffffffffff;
  auVar29._8_4_ = valid0.field_0._8_4_ ^ 0xffffffff;
  auVar29._12_4_ = valid0.field_0._12_4_ ^ 0xffffffff;
  local_17a8 = local_17a8 | auVar29;
  uVar11 = movmskps(uVar11,local_17a8);
  uVar12 = (ulong)uVar11;
  if (uVar11 == 0xf) goto LAB_006dc8e0;
  auVar94 = blendvps(auVar94,_DAT_01f45a40,local_17a8);
  iVar13 = 0x7f800000;
  iVar21 = 0x7f800000;
  iVar90 = 0x7f800000;
  iVar91 = 0x7f800000;
  goto LAB_006dc677;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }